

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<ExpressionAstNode>_> * __thiscall
Parser::parseExpression
          (optional<std::shared_ptr<ExpressionAstNode>_> *__return_storage_ptr__,Parser *this)

{
  uint uVar1;
  undefined1 local_38 [24];
  
  skipWhiteSpace(this);
  (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>).
  _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
  TokenBuffer::currentToken((TokenBuffer *)local_38);
  uVar1 = *(uint *)&(((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                       *)(local_38._0_8_ + 0x18))->
                    super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  if (uVar1 < 0x1d) {
    if ((0xe300000U >> (uVar1 & 0x1f) & 1) != 0) {
      parseLiteralExpression((optional<std::shared_ptr<LiteralExpressionAstNode>_> *)local_38,this);
      std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
                ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,
                 (optional<std::shared_ptr<LiteralExpressionAstNode>_> *)local_38);
      std::_Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_>::_M_reset
                ((_Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_> *)local_38);
      goto LAB_0010c0f1;
    }
    if (uVar1 == 9) {
      parseFunctionDeclarationExpression
                ((optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)local_38,this);
      std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
                ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,
                 (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)local_38);
      std::_Optional_payload_base<std::shared_ptr<FunctionDeclarationExpressionAstNode>_>::_M_reset
                ((_Optional_payload_base<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)
                 local_38);
      goto LAB_0010c0f1;
    }
    if (uVar1 == 0x1c) {
      parseBuiltInFunctionInvocationExpression
                ((optional<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_> *)local_38,
                 this);
      std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
                ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,
                 (optional<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_> *)local_38)
      ;
      std::_Optional_payload_base<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_>::
      _M_reset((_Optional_payload_base<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_>
                *)local_38);
      goto LAB_0010c0f1;
    }
  }
  if (uVar1 == 2) {
    parseObjectDeclarationExpression
              ((optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> *)local_38,this);
    std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
              ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,
               (optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> *)local_38);
    std::_Optional_payload_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> *)
               local_38);
  }
  else {
    parseIdentifierOrFunctionInvocationExpression
              ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_38,this);
    std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_copy_assign
              ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)__return_storage_ptr__
               ,(_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)local_38);
    std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)local_38);
  }
LAB_0010c0f1:
  skipWhiteSpace(this);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ExpressionAstNode>>
Parser::parseExpression() noexcept {
  this->skipWhiteSpace();

  std::optional<std::shared_ptr<ExpressionAstNode>> e;

  switch (this->tokenBuffer->currentToken()->tokenType)  {
    case TokenType::LeftCurly:
      e = this->parseObjectDeclarationExpression();
      this->skipWhiteSpace();
      return e;
    case TokenType::Function:
      e = this->parseFunctionDeclarationExpression();
      this->skipWhiteSpace();
      return e;
    case TokenType::BooleanLiteral:
    case TokenType::StringLiteral:
    case TokenType::IntegerLiteral:
    case TokenType::FloatLiteral:
    case TokenType::UndefinedLiteral:
      e = this->parseLiteralExpression();
      this->skipWhiteSpace();
      return e;
    case TokenType::BuiltInFunctionName:
      e = this->parseBuiltInFunctionInvocationExpression();
      this->skipWhiteSpace();
      return e;
    default:
      e = this->parseIdentifierOrFunctionInvocationExpression();
      this->skipWhiteSpace();
      return e;
  }
}